

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QDBusSignature>::eraseLast(QGenericArrayOps<QDBusSignature> *this)

{
  qsizetype *pqVar1;
  QDBusSignature *pQVar2;
  long lVar3;
  Data *pDVar4;
  
  pQVar2 = (this->super_QArrayDataPointer<QDBusSignature>).ptr;
  lVar3 = (this->super_QArrayDataPointer<QDBusSignature>).size;
  pDVar4 = pQVar2[lVar3 + -1].m_signature.d.d;
  if (pDVar4 != (Data *)0x0) {
    LOCK();
    (pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)(pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int> == 0) {
      QArrayData::deallocate(&(pQVar2[lVar3 + -1].m_signature.d.d)->super_QArrayData,2,0x10);
    }
  }
  pqVar1 = &(this->super_QArrayDataPointer<QDBusSignature>).size;
  *pqVar1 = *pqVar1 + -1;
  return;
}

Assistant:

void eraseLast() noexcept
    {
        Q_ASSERT(this->isMutable());
        Q_ASSERT(this->size);
        (this->end() - 1)->~T();
        --this->size;
    }